

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O2

HeapType __thiscall
wasm::GlobalTypeRewriter::mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::
HeapType>,std::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::
HeapType>>>const&)::CodeUpdater::getNew(wasm::HeapType_(void *this,HeapType type)

{
  const_iterator cVar1;
  key_type *pkVar2;
  key_type local_18;
  HeapType type_local;
  
  if (0xd < type.id) {
    local_18.id = type.id;
    cVar1 = std::
            _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(*(_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     **)((long)this + 0x108),&local_18);
    pkVar2 = (key_type *)
             ((long)cVar1.
                    super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                    ._M_cur + 0x10);
    if (cVar1.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>.
        _M_cur == (__node_type *)0x0) {
      pkVar2 = &local_18;
    }
    type.id = pkVar2->id;
  }
  return (HeapType)type.id;
}

Assistant:

HeapType getNew(HeapType type) {
      if (type.isBasic()) {
        return type;
      }
      auto iter = oldToNewTypes.find(type);
      if (iter != oldToNewTypes.end()) {
        return iter->second;
      }
      return type;
    }